

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O2

void __thiscall QTipLabel::setTipRect(QTipLabel *this,QWidget *w,QRect *r)

{
  Representation RVar1;
  Representation RVar2;
  Representation RVar3;
  bool bVar4;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = QRect::isNull(r);
  if (w == (QWidget *)0x0 && !bVar4) {
    local_40[0] = '\x02';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    local_40[0x14] = '\0';
    local_40[0x15] = '\0';
    local_40[0x16] = '\0';
    local_40[0x17] = '\0';
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[6] = '\0';
    local_40[7] = '\0';
    local_40[8] = '\0';
    local_40[9] = '\0';
    local_40[10] = '\0';
    local_40[0xb] = '\0';
    local_40[0xc] = '\0';
    local_40[0xd] = '\0';
    local_40[0xe] = '\0';
    local_40[0xf] = '\0';
    local_40[0x10] = '\0';
    local_40[0x11] = '\0';
    local_40[0x12] = '\0';
    local_40[0x13] = '\0';
    local_28 = "default";
    QMessageLogger::warning(local_40,"QToolTip::setTipRect: Cannot pass null widget if rect is set")
    ;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_003801d8;
  }
  else {
    this->widget = w;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_003801d8:
      __stack_chk_fail();
    }
    RVar1.m_i = (r->y1).m_i;
    RVar2.m_i = (r->x2).m_i;
    RVar3.m_i = (r->y2).m_i;
    (this->rect).x1 = (Representation)(r->x1).m_i;
    (this->rect).y1 = (Representation)RVar1.m_i;
    (this->rect).x2 = (Representation)RVar2.m_i;
    (this->rect).y2 = (Representation)RVar3.m_i;
  }
  return;
}

Assistant:

void QTipLabel::setTipRect(QWidget *w, const QRect &r)
{
    if (Q_UNLIKELY(!r.isNull() && !w)) {
        qWarning("QToolTip::setTipRect: Cannot pass null widget if rect is set");
        return;
    }
    widget = w;
    rect = r;
}